

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O3

void __thiscall irr::gui::CGUISkin::~CGUISkin(CGUISkin *this)

{
  ~CGUISkin(this,&VTT);
  operator_delete(this,0x280);
  return;
}

Assistant:

CGUISkin::~CGUISkin()
{
	for (u32 i = 0; i < EGDF_COUNT; ++i) {
		if (Fonts[i])
			Fonts[i]->drop();
	}

	if (SpriteBank)
		SpriteBank->drop();
}